

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.hpp
# Opt level: O0

void __thiscall
boost::scoped_ptr<boost::io::ios_base_all_saver>::reset
          (scoped_ptr<boost::io::ios_base_all_saver> *this,ios_base_all_saver *p)

{
  ios_base_all_saver *in_RSI;
  scoped_ptr<boost::io::ios_base_all_saver> *in_RDI;
  bool bVar1;
  scoped_ptr<boost::io::ios_base_all_saver> local_18 [3];
  
  bVar1 = true;
  if (in_RSI != (ios_base_all_saver *)0x0) {
    bVar1 = in_RSI != in_RDI->px;
  }
  if (!bVar1) {
    __assert_fail("p == 0 || p != px",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/smart_ptr/scoped_ptr.hpp"
                  ,0x5d,
                  "void boost::scoped_ptr<boost::io::ios_base_all_saver>::reset(T *) [T = boost::io::ios_base_all_saver]"
                 );
  }
  scoped_ptr(local_18,in_RSI);
  swap(local_18,in_RDI);
  ~scoped_ptr((scoped_ptr<boost::io::ios_base_all_saver> *)0x23f5ba);
  return;
}

Assistant:

void reset(T * p = 0) BOOST_SP_NOEXCEPT_WITH_ASSERT
    {
        BOOST_ASSERT( p == 0 || p != px ); // catch self-reset errors
        this_type(p).swap(*this);
    }